

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O2

void ELFIO::dump::note(ostream *out,int no,Elf_Word type,string *name,void *desc,Elf_Word descsz)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  note_tag_t *pnVar4;
  __normal_iterator<const_ELFIO::note_tag_t::note_values_t_*,_std::vector<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>_>
  _Var5;
  Elf_Word i;
  ulong uVar6;
  Elf_Word type_local;
  Elf_Word local_3c;
  string *local_38;
  
  type_local = type;
  poVar3 = std::operator<<(out,"  [");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = std::operator<<(poVar3,0x20);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,no);
  std::operator<<(poVar3,"] ");
  local_38 = name;
  pnVar4 = std::
           __find_if<ELFIO::note_tag_t_const*,__gnu_cxx::__ops::_Iter_pred<ELFIO::dump::note(std::ostream&,int,unsigned_int,std::__cxx11::string_const&,void*,unsigned_int)::_lambda(ELFIO::note_tag_t_const&)_1_>>
                     (note_tag_table,&_end,name);
  local_3c = descsz;
  if (pnVar4 != (note_tag_t *)&_end) {
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<ELFIO::note_tag_t::note_values_t_const*,std::vector<ELFIO::note_tag_t::note_values_t,std::allocator<ELFIO::note_tag_t::note_values_t>>>,__gnu_cxx::__ops::_Iter_pred<ELFIO::dump::note(std::ostream&,int,unsigned_int,std::__cxx11::string_const&,void*,unsigned_int)::_lambda(ELFIO::note_tag_t::note_values_t_const&)_1_>>
                      ((pnVar4->values).
                       super__Vector_base<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pnVar4->values).
                       super__Vector_base<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&type_local);
    if (_Var5._M_current !=
        (pnVar4->values).
        super__Vector_base<ELFIO::note_tag_t::note_values_t,_std::allocator<ELFIO::note_tag_t::note_values_t>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0xc;
      poVar3 = std::operator<<(out,0x20);
      lVar1 = *(long *)poVar3;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffff4f | 0x20;
      poVar3 = std::operator<<(poVar3,(string *)pnVar4);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,"0x");
      *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 8;
      poVar3 = std::operator<<(poVar3,0x30);
      lVar1 = *(long *)poVar3;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffff4f | 0x80;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,(string *)&(_Var5._M_current)->type_str);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = std::operator<<(poVar3,(string *)&(_Var5._M_current)->description);
      std::operator<<(poVar3,")");
      goto LAB_00110b8c;
    }
  }
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0xc;
  poVar3 = std::operator<<(out,0x20);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffff4f | 0x20;
  poVar3 = std::operator<<(poVar3,(string *)local_38);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,"0x");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 8;
  poVar3 = std::operator<<(poVar3,0x30);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,"0x");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 8;
  poVar3 = std::operator<<(poVar3,0x30);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
LAB_00110b8c:
  if (local_3c != 0) {
    for (uVar6 = 0; descsz != uVar6; uVar6 = uVar6 + 1) {
      if ((uVar6 & 0xf) == 0) {
        poVar3 = std::endl<char,std::char_traits<char>>(out);
        std::operator<<(poVar3,"         ");
      }
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 2;
      poVar3 = std::operator<<(out,0x30);
      lVar1 = *(long *)poVar3;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffff4f | 0x80;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    }
  }
  return;
}

Assistant:

static void note( std::ostream&      out,
                      int                no,
                      Elf_Word           type,
                      const std::string& name,
                      void*              desc,
                      Elf_Word           descsz )
    {
        out << "  [" << DUMP_DEC_FORMAT( 2 ) << no << "] ";

        const auto name_group = std::find_if(
            std::begin( note_tag_table ), std::end( note_tag_table ),
            [&name]( const note_tag_t& entry ) { return entry.name == name; } );

        std::vector<note_tag_t::note_values_t>::const_iterator type_value;
        if ( name_group != std::end( note_tag_table ) ) {
            type_value = std::find_if(
                name_group->values.begin(), name_group->values.end(),
                [&type]( const note_tag_t::note_values_t& e ) {
                    return e.type == type;
                } );
        }

        if ( name_group != std::end( note_tag_table ) &&
             type_value != name_group->values.end() ) {
            out << DUMP_STR_FORMAT( 12 ) << name_group->name << " "
                << DUMP_HEX0x_FORMAT( 8 ) << descsz << " "
                << type_value->type_str << " (" << type_value->description
                << ")";
        }
        else {
            out << DUMP_STR_FORMAT( 12 ) << name << " "
                << DUMP_HEX0x_FORMAT( 8 ) << descsz << " "
                << DUMP_HEX0x_FORMAT( 8 ) << type;
        }

        if ( descsz != 0 ) {
            for ( Elf_Word i = 0; i < descsz; ++i ) {
                if ( i % 16 == 0 ) {
                    out << std::endl << "         ";
                }
                out << DUMP_HEX_FORMAT( 2 )
                    << (uint32_t)( (uint8_t*)( desc ) )[i];
            }
        }
    }